

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O3

void __thiscall trun::Config::Dump(Config *this)

{
  pointer pbVar1;
  pointer pcVar2;
  string *psVar3;
  ResultSummary *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  char *pcVar4;
  pointer pbVar5;
  char *pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> x;
  ModuleExecutionType in_stack_ffffffffffffffac;
  TestExecutiontype in_stack_ffffffffffffffb0;
  long *plVar7;
  long local_40 [2];
  
  puts("Current Configuration");
  printf("TestRunner v%s - %s\n",(this->version)._M_dataplus._M_p,
         (this->description)._M_dataplus._M_p);
  pcVar6 = "yes";
  pcVar4 = "yes";
  if (this->verbose == 0) {
    pcVar4 = "no";
  }
  printf("  Verbose....: %s (%d)\n",pcVar4);
  pcVar4 = "yes";
  if (this->listTests == false) {
    pcVar4 = "no";
  }
  printf("  List Tests.: %s\n",pcVar4);
  pcVar4 = "yes";
  if (this->executeTests == false) {
    pcVar4 = "no";
  }
  printf("  Run Tests..: %s\n",pcVar4);
  pcVar4 = "yes";
  if (this->printPassSummary == false) {
    pcVar4 = "no";
  }
  printf("  Pass in summary: %s\n",pcVar4);
  printf("  TestMain...: %s\n",(this->mainFuncName)._M_dataplus._M_p);
  pcVar4 = "yes";
  if (this->testModuleGlobals == false) {
    pcVar4 = "no";
  }
  printf("  Test Module Globals: %s\n",pcVar4);
  pcVar4 = "yes";
  if (this->testGlobalMain == false) {
    pcVar4 = "no";
  }
  printf("  Test Main Global: %s\n",pcVar4);
  pcVar4 = "yes";
  if (this->testLogFilter == false) {
    pcVar4 = "no";
  }
  printf("  TestCase Log Filter: %s\n",pcVar4);
  printf("  Response Message Size Limit: %u\n",(ulong)this->responseMsgByteLimit);
  pcVar4 = "yes";
  if (this->skipOnModuleFail == false) {
    pcVar4 = "no";
  }
  printf("  Skip rest on library failure: %s\n",pcVar4);
  pcVar4 = "yes";
  if (this->stopOnAllFail == false) {
    pcVar4 = "no";
  }
  printf("  Stop on full failure: %s\n",pcVar4);
  pcVar4 = "yes";
  if (this->suppressProgressMsg == false) {
    pcVar4 = "no";
  }
  printf("  Silent mode: %s\n",pcVar4);
  pcVar4 = "yes";
  if (this->discardTestReturnCode == false) {
    pcVar4 = "no";
  }
  printf("  Discard test return code: %s\n",pcVar4);
  printf("  Reporting module: %s\n",(this->reportingModule)._M_dataplus._M_p);
  printf("  Reporting indent size: %d\n",(ulong)(uint)this->reportIndent);
  psVar3 = ModuleExecutionTypeToStr_abi_cxx11_(in_stack_ffffffffffffffac);
  printf("  Module execution policy: %s\n",(psVar3->_M_dataplus)._M_p);
  psVar3 = TestExecutionTypeToStr_abi_cxx11_(in_stack_ffffffffffffffb0);
  printf("  Testcase execution policy: %s\n",(psVar3->_M_dataplus)._M_p);
  if (this->continueOnAssert == false) {
    pcVar6 = "no";
  }
  printf("  Continue on assert: %s\n",pcVar6);
  puts("  Modules:");
  pbVar5 = (this->modules).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->modules).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar5 != pbVar1) {
    do {
      pcVar2 = (pbVar5->_M_dataplus)._M_p;
      plVar7 = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&stack0xffffffffffffffb0,pcVar2,pcVar2 + pbVar5->_M_string_length);
      printf("    %s\n",plVar7);
      if (plVar7 != local_40) {
        operator_delete(plVar7,local_40[0] + 1);
      }
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != pbVar1);
  }
  puts("  Test cases:");
  pbVar5 = (this->testcases).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->testcases).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar5 != pbVar1) {
    do {
      pcVar2 = (pbVar5->_M_dataplus)._M_p;
      plVar7 = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&stack0xffffffffffffffb0,pcVar2,pcVar2 + pbVar5->_M_string_length);
      printf("    %s\n",plVar7);
      if (plVar7 != local_40) {
        operator_delete(plVar7,local_40[0] + 1);
      }
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != pbVar1);
  }
  puts("  Inputs:");
  pbVar5 = (this->inputs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->inputs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar5 != pbVar1) {
    do {
      pcVar2 = (pbVar5->_M_dataplus)._M_p;
      plVar7 = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&stack0xffffffffffffffb0,pcVar2,pcVar2 + pbVar5->_M_string_length);
      printf("    %s\n",plVar7);
      if (plVar7 != local_40) {
        operator_delete(plVar7,local_40[0] + 1);
      }
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != pbVar1);
  }
  this_00 = ResultSummary::Instance();
  ResultSummary::ListReportingModules(this_00);
  putchar(10);
  return;
}

Assistant:

void Config::Dump() {
    printf("Current Configuration\n");
    printf("TestRunner v%s - %s\n", version.c_str(), description.c_str());
    printf("  Verbose....: %s (%d)\n",verbose?"yes":"no", verbose);
    printf("  List Tests.: %s\n", listTests?"yes":"no");
    printf("  Run Tests..: %s\n", executeTests?"yes":"no");
    printf("  Pass in summary: %s\n", printPassSummary?"yes":"no");
    printf("  TestMain...: %s\n", mainFuncName.c_str());
    printf("  Test Module Globals: %s\n", testModuleGlobals ? "yes" : "no");
    printf("  Test Main Global: %s\n", testGlobalMain?"yes":"no");
    printf("  TestCase Log Filter: %s\n", testLogFilter?"yes":"no");
    printf("  Response Message Size Limit: %" PRIu32 "\n", responseMsgByteLimit);
    printf("  Skip rest on library failure: %s\n", skipOnModuleFail?"yes":"no");
    printf("  Stop on full failure: %s\n", stopOnAllFail?"yes":"no");
    printf("  Silent mode: %s\n", suppressProgressMsg?"yes":"no");
    printf("  Discard test return code: %s\n", discardTestReturnCode?"yes":"no");
    printf("  Reporting module: %s\n", reportingModule.c_str());
    printf("  Reporting indent size: %d\n", reportIndent);
    printf("  Module execution policy: %s\n", ModuleExecutionTypeToStr(moduleExecuteType).c_str());
    printf("  Testcase execution policy: %s\n", TestExecutionTypeToStr(testExecutionType).c_str());
    printf("  Continue on assert: %s\n", continueOnAssert?"yes":"no");
    printf("  Modules:\n");
    for(auto x:modules) {
        printf("    %s\n", x.c_str());
    }
    printf("  Test cases:\n");
    for(auto x:testcases) {
        printf("    %s\n", x.c_str());
    }
    printf("  Inputs:\n");
    for(auto x:inputs) {
        printf("    %s\n", x.c_str());

    }
    ResultSummary::Instance().ListReportingModules();
    printf("\n");

}